

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

ArgSlot EmitNewObjectOfConstants
                  (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  uint argCount)

{
  ArgSlot AVar1;
  RegSlot RVar2;
  uint32 byteCount;
  VarArrayVarCount *obj;
  ParseNodeCall *pPVar3;
  VarArrayVarCount *vars;
  ByteCodeGenerator *byteCodeGenerator_00;
  uint argCount_00;
  
  argCount_00 = argCount - 1;
  if (argCount_00 < 0x20000000) {
    obj = (VarArrayVarCount *)new<Memory::ArenaAllocator>(8,byteCodeGenerator->alloc,0x35916e,0);
    obj->count = (Var)((ulong)argCount_00 | 0x1000000000000);
    vars = obj + 1;
    byteCodeGenerator_00 = (ByteCodeGenerator *)pnode;
    pPVar3 = ParseNode::AsParseNodeCall(pnode);
    EmitConstantArgsToVarArray(byteCodeGenerator_00,&vars->count,pPVar3->pnodeArgs,argCount_00);
    RVar2 = (RegSlot)vars;
    pPVar3 = ParseNode::AsParseNodeCall(pnode);
    AVar1 = EmitArgListEnd(pPVar3->pnodeArgs,RVar2,0xffffffff,0xffffffff,byteCodeGenerator,funcInfo,
                           (ulong)argCount_00,0xffff);
    pPVar3 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::RemoveEntryForRegSlotFromCacheIdMap
              (&byteCodeGenerator->m_writer,pPVar3->pnodeTarget->location);
    RVar2 = FuncInfo::AcquireLoc(funcInfo,pnode);
    byteCount = UInt32Math::MulAdd<8u,8u>(argCount_00);
    pPVar3 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::AuxiliaryContext
              (&byteCodeGenerator->m_writer,NewScObject_A,RVar2,obj,byteCount,
               pPVar3->pnodeTarget->location);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::VarArrayVarCount>
              (byteCodeGenerator->alloc,obj,(ulong)(argCount_00 * 8));
    return AVar1;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::ArgSlot EmitNewObjectOfConstants(
    ParseNode *pnode,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    unsigned int argCount)
{
    EmitArgListStart(Js::Constants::NoRegister, byteCodeGenerator, funcInfo, Js::Constants::NoProfileId);

    // Create the vars array
    Js::VarArrayVarCount *vars = AnewPlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount - 1), sizeof(Js::Var)), Js::VarArrayVarCount, Js::TaggedInt::ToVarUnchecked(argCount - 1));

    // Emit all constants to the vars array
    EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, pnode->AsParseNodeCall()->pnodeArgs, argCount - 1);

    // Finish the arg list
    Js::ArgSlot actualArgCount = EmitArgListEnd(
        pnode->AsParseNodeCall()->pnodeArgs,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        byteCodeGenerator,
        funcInfo,
        argCount - 1,
        Js::Constants::NoProfileId);

    // Make sure the cacheId to regSlot map in the ByteCodeWriter is left in a consistent state after writing NewScObject_A
    byteCodeGenerator->Writer()->RemoveEntryForRegSlotFromCacheIdMap(pnode->AsParseNodeCall()->pnodeTarget->location);

    // Generate the opcode with vars
    byteCodeGenerator->Writer()->AuxiliaryContext(
        Js::OpCode::NewScObject_A,
        funcInfo->AcquireLoc(pnode),
        vars,
        UInt32Math::MulAdd<sizeof(Js::Var), sizeof(Js::VarArray)>((argCount-1)),
        pnode->AsParseNodeCall()->pnodeTarget->location);


        AdeletePlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount-1), sizeof(Js::VarArrayVarCount)), vars);

    return actualArgCount;
}